

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

void __thiscall chaiscript::exception::eval_error::eval_error(eval_error *this,eval_error *param_1)

{
  std::runtime_error::runtime_error((runtime_error *)this,(runtime_error *)param_1);
  *(undefined ***)this = &PTR__eval_error_00699e38;
  std::__cxx11::string::string((string *)&this->reason,&param_1->reason);
  this->start_position = param_1->start_position;
  std::__cxx11::string::string((string *)&this->filename,&param_1->filename);
  std::__cxx11::string::string((string *)&this->detail,&param_1->detail);
  Catch::clara::std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
  ::vector(&this->call_stack,&param_1->call_stack);
  return;
}

Assistant:

eval_error(const eval_error &) = default;